

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

OPTIONHANDLER_HANDLE tlsio_openssl_retrieveoptions(CONCRETE_IO_HANDLE handle)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE handle_00;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  void *ptr;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  OPTIONHANDLER_HANDLE underlying_io_options;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  CONCRETE_IO_HANDLE handle_local;
  
  if (handle == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_retrieveoptions",0x13f,1,
                "invalid parameter detected: CONCRETE_IO_HANDLE handle=%p",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)
        OptionHandler_Create
                  (tlsio_openssl_CloneOption,tlsio_openssl_DestroyOption,tlsio_openssl_setoption);
    if ((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_retrieveoptions",0x147,1,"unable to OptionHandler_Create");
      }
    }
    else {
      handle_00 = xio_retrieveoptions(*handle);
      if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_retrieveoptions",0x152,1,
                    "unable to retrieve underlying_io options");
        }
        OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        OVar1 = OptionHandler_AddOption((OPTIONHANDLER_HANDLE)l,"underlying_io_options",handle_00);
        if (OVar1 == OPTIONHANDLER_OK) {
          if ((*(long *)((long)handle + 0x70) == 0) ||
             (OVar1 = OptionHandler_AddOption
                                ((OPTIONHANDLER_HANDLE)l,"TrustedCerts",
                                 *(void **)((long)handle + 0x70)), OVar1 == OPTIONHANDLER_OK)) {
            if ((*(long *)((long)handle + 0x78) == 0) ||
               (OVar1 = OptionHandler_AddOption
                                  ((OPTIONHANDLER_HANDLE)l,"CipherSuite",
                                   *(void **)((long)handle + 0x78)), OVar1 == OPTIONHANDLER_OK)) {
              if ((*(long *)((long)handle + 0x80) == 0) ||
                 (OVar1 = OptionHandler_AddOption
                                    ((OPTIONHANDLER_HANDLE)l,"x509certificate",
                                     *(void **)((long)handle + 0x80)), OVar1 == OPTIONHANDLER_OK)) {
                if ((*(long *)((long)handle + 0x88) == 0) ||
                   (OVar1 = OptionHandler_AddOption
                                      ((OPTIONHANDLER_HANDLE)l,"x509privatekey",
                                       *(void **)((long)handle + 0x88)), OVar1 == OPTIONHANDLER_OK))
                {
                  if ((*(int *)((long)handle + 0x90) == 0) ||
                     (OVar1 = OptionHandler_AddOption
                                        ((OPTIONHANDLER_HANDLE)l,"tls_version",
                                         (void *)((long)handle + 0x90)), OVar1 == OPTIONHANDLER_OK))
                  {
                    if ((*(long *)((long)handle + 0xb0) == 0) ||
                       (OVar1 = OptionHandler_AddOption
                                          ((OPTIONHANDLER_HANDLE)l,"Engine",
                                           *(void **)((long)handle + 0xb0)),
                       OVar1 == OPTIONHANDLER_OK)) {
                      if ((*(int *)((long)handle + 200) == 0) ||
                         (OVar1 = OptionHandler_AddOption
                                            ((OPTIONHANDLER_HANDLE)l,"x509PrivatekeyType",
                                             (void *)((long)handle + 200)),
                         OVar1 == OPTIONHANDLER_OK)) {
                        if (*(long *)((long)handle + 0x98) != 0) {
                          OVar1 = OptionHandler_AddOption
                                            ((OPTIONHANDLER_HANDLE)l,"tls_validation_callback",
                                             *(void **)((long)handle + 0x98));
                          if (OVar1 != OPTIONHANDLER_OK) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                        ,"tlsio_openssl_retrieveoptions",0x1a0,1,
                                        "unable to save tls_validation_callback option");
                            }
                            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                            l = (LOGGER_LOG)0x0;
                          }
                          OVar1 = OptionHandler_AddOption
                                            ((OPTIONHANDLER_HANDLE)l,"tls_validation_callback_data",
                                             *(void **)((long)handle + 0xa0));
                          if (OVar1 != OPTIONHANDLER_OK) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                        ,"tlsio_openssl_retrieveoptions",0x1a7,1,
                                        "unable to save tls_validation_callback_data option");
                            }
                            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                            l = (LOGGER_LOG)0x0;
                          }
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                    ,"tlsio_openssl_retrieveoptions",400,1,
                                    "unable to save x509PrivatekeyType option");
                        }
                        OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                        l = (LOGGER_LOG)0x0;
                      }
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                  ,"tlsio_openssl_retrieveoptions",0x187,1,
                                  "unable to save Engine option");
                      }
                      OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                      l = (LOGGER_LOG)0x0;
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                                ,"tlsio_openssl_retrieveoptions",0x17e,1,
                                "unable to save tls_version option");
                    }
                    OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                    l = (LOGGER_LOG)0x0;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                              ,"tlsio_openssl_retrieveoptions",0x178,1,
                              "unable to save x509 privatekey option");
                  }
                  OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                  l = (LOGGER_LOG)0x0;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                            ,"tlsio_openssl_retrieveoptions",0x172,1,
                            "unable to save x509 certificate option");
                }
                OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                          ,"tlsio_openssl_retrieveoptions",0x16c,1,
                          "unable to save CipherSuite option");
              }
              OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                        ,"tlsio_openssl_retrieveoptions",0x163,1,
                        "unable to save TrustedCerts option");
            }
            OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                      ,"tlsio_openssl_retrieveoptions",0x15a,1,
                      "unable to save underlying_io options");
          }
          OptionHandler_Destroy((OPTIONHANDLER_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
        OptionHandler_Destroy(handle_00);
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

static OPTIONHANDLER_HANDLE tlsio_openssl_retrieveoptions(CONCRETE_IO_HANDLE handle)
{
    OPTIONHANDLER_HANDLE result;
    if (handle == NULL)
    {
        LogError("invalid parameter detected: CONCRETE_IO_HANDLE handle=%p", handle);
        result = NULL;
    }
    else
    {
        result = OptionHandler_Create(tlsio_openssl_CloneOption, tlsio_openssl_DestroyOption, tlsio_openssl_setoption);
        if (result == NULL)
        {
            LogError("unable to OptionHandler_Create");
            /*return as is*/
        }
        else
        {
            /*this layer cares about the certificates and the x509 credentials*/
            TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)handle;
            OPTIONHANDLER_HANDLE underlying_io_options;

            if ((underlying_io_options = xio_retrieveoptions(tls_io_instance->underlying_io)) == NULL)
            {
                LogError("unable to retrieve underlying_io options");
                OptionHandler_Destroy(result);
                result = NULL;
            }
            else
            {
                if (OptionHandler_AddOption(result, OPTION_UNDERLYING_IO_OPTIONS, underlying_io_options) != OPTIONHANDLER_OK)
                {
                    LogError("unable to save underlying_io options");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->certificate != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_TRUSTED_CERT, tls_io_instance->certificate) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save TrustedCerts option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->cipher_list != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_CIPHER_SUITE, tls_io_instance->cipher_list) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save CipherSuite option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->x509_certificate != NULL && (OptionHandler_AddOption(result, SU_OPTION_X509_CERT, tls_io_instance->x509_certificate) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save x509 certificate option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->x509_private_key != NULL && (OptionHandler_AddOption(result, SU_OPTION_X509_PRIVATE_KEY, tls_io_instance->x509_private_key) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save x509 privatekey option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->tls_version != 0 && (OptionHandler_AddOption(result, OPTION_TLS_VERSION, &tls_io_instance->tls_version) != OPTIONHANDLER_OK) )
                {
                    LogError("unable to save tls_version option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->engine_id != NULL) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_ENGINE, tls_io_instance->engine_id) != OPTIONHANDLER_OK)
                    )
                {
                    LogError("unable to save Engine option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (
                    (tls_io_instance->x509_private_key_type != KEY_TYPE_DEFAULT) &&
                    (OptionHandler_AddOption(result, OPTION_OPENSSL_PRIVATE_KEY_TYPE, &tls_io_instance->x509_private_key_type))
                    )
                {
                    LogError("unable to save x509PrivatekeyType option");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else if (tls_io_instance->tls_validation_callback != NULL)
                {
#ifdef WIN32
#pragma warning(push)
#pragma warning(disable:4152)
#endif
                    void* ptr = tls_io_instance->tls_validation_callback;
#ifdef WIN32
#pragma warning(pop)
#endif
                    if (OptionHandler_AddOption(result, "tls_validation_callback", (const char*)ptr) != OPTIONHANDLER_OK)
                    {
                        LogError("unable to save tls_validation_callback option");
                        OptionHandler_Destroy(result);
                        result = NULL;
                    }

                    if (OptionHandler_AddOption(result, "tls_validation_callback_data", (const char*)tls_io_instance->tls_validation_callback_data) != OPTIONHANDLER_OK)
                    {
                        LogError("unable to save tls_validation_callback_data option");
                        OptionHandler_Destroy(result);
                        result = NULL;
                    }
                }
                else
                {
                    /*all is fine, all interesting options have been saved*/
                    /*return as is*/
                }

                // Must destroy since OptionHandler_AddOption creates a copy of it. 
                OptionHandler_Destroy(underlying_io_options); 
            }
        }
    }
    return result;
}